

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u32 jsonbPayloadSize(JsonParse *pParse,u32 i,u32 *pSz)

{
  uint uVar1;
  u8 *puVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  u32 uVar6;
  u32 uVar7;
  
  uVar1 = pParse->nBlob;
  uVar6 = 0;
  if (uVar1 < i) {
LAB_001b9873:
    uVar4 = 0;
    uVar7 = uVar6;
  }
  else {
    puVar2 = pParse->aBlob;
    bVar3 = puVar2[i] >> 4;
    uVar7 = (u32)bVar3;
    if (puVar2[i] < 0xc0) {
      uVar4 = 1;
    }
    else if (bVar3 == 0xe) {
      uVar4 = 0;
      uVar7 = uVar6;
      if (uVar1 <= i + 4) goto LAB_001b98b8;
      uVar7 = (uint)puVar2[i + 4] |
              (uint)puVar2[i + 3] << 8 | (uint)puVar2[i + 2] << 0x10 | (uint)puVar2[i + 1] << 0x18;
      uVar4 = 5;
    }
    else if (uVar7 == 0xd) {
      uVar4 = 0;
      uVar7 = uVar6;
      if (uVar1 <= i + 2) goto LAB_001b98b8;
      uVar7 = (u32)CONCAT11(puVar2[i + 1],puVar2[i + 2]);
      uVar4 = 3;
    }
    else if (uVar7 == 0xc) {
      uVar4 = 0;
      uVar7 = uVar6;
      if (uVar1 <= i + 1) goto LAB_001b98b8;
      uVar7 = (u32)puVar2[i + 1];
      uVar4 = 2;
    }
    else {
      if ((((uVar1 <= i + 8) || (puVar2[i + 1] != '\0')) || (puVar2[i + 2] != '\0')) ||
         (puVar2[i + 3] != '\0')) goto LAB_001b9873;
      uVar4 = 0;
      uVar7 = uVar6;
      if (puVar2[i + 4] != '\0') goto LAB_001b98b8;
      uVar7 = (uint)puVar2[i + 8] |
              (uint)puVar2[i + 7] << 8 | (uint)puVar2[i + 6] << 0x10 | (uint)puVar2[i + 5] << 0x18;
      uVar4 = 9;
    }
    uVar5 = (ulong)i + (ulong)uVar4 + (ulong)uVar7;
    if ((uVar1 < uVar5) && (uVar1 - pParse->delta < uVar5)) {
      uVar7 = 0;
      uVar4 = 0;
    }
  }
LAB_001b98b8:
  *pSz = uVar7;
  return uVar4;
}

Assistant:

static u32 jsonbPayloadSize(const JsonParse *pParse, u32 i, u32 *pSz){
  u8 x;
  u32 sz;
  u32 n;
  if( NEVER(i>pParse->nBlob) ){
    *pSz = 0;
    return 0;
  }
  x = pParse->aBlob[i]>>4;
  if( x<=11 ){
    sz = x;
    n = 1;
  }else if( x==12 ){
    if( i+1>=pParse->nBlob ){
      *pSz = 0;
      return 0;
    }
    sz = pParse->aBlob[i+1];
    n = 2;
  }else if( x==13 ){
    if( i+2>=pParse->nBlob ){
      *pSz = 0;
      return 0;
    }
    sz = (pParse->aBlob[i+1]<<8) + pParse->aBlob[i+2];
    n = 3;
  }else if( x==14 ){
    if( i+4>=pParse->nBlob ){
      *pSz = 0;
      return 0;
    }
    sz = ((u32)pParse->aBlob[i+1]<<24) + (pParse->aBlob[i+2]<<16) +
         (pParse->aBlob[i+3]<<8) + pParse->aBlob[i+4];
    n = 5;
  }else{
    if( i+8>=pParse->nBlob
     || pParse->aBlob[i+1]!=0
     || pParse->aBlob[i+2]!=0
     || pParse->aBlob[i+3]!=0
     || pParse->aBlob[i+4]!=0
    ){
      *pSz = 0;
      return 0;
    }
    sz = (pParse->aBlob[i+5]<<24) + (pParse->aBlob[i+6]<<16) +
         (pParse->aBlob[i+7]<<8) + pParse->aBlob[i+8];
    n = 9;
  }
  if( (i64)i+sz+n > pParse->nBlob
   && (i64)i+sz+n > pParse->nBlob-pParse->delta
  ){
    sz = 0;
    n = 0;
  }
  *pSz = sz;
  return n;
}